

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void EditTableSizingFlags(ImGuiTableFlags *p_flags)

{
  char *label;
  bool bVar1;
  ImGuiStyle *pIVar2;
  long lVar3;
  float fVar4;
  char *local_38;
  int local_30;
  int m;
  int local_24;
  char *pcStack_20;
  int n;
  char *preview_text;
  uint *puStack_10;
  int idx;
  ImGuiTableFlags *p_flags_local;
  
  preview_text._4_4_ = 0;
  while ((preview_text._4_4_ < 5 &&
         (EditTableSizingFlags::policies[preview_text._4_4_].Value != (*p_flags & 0xe000U)))) {
    preview_text._4_4_ = preview_text._4_4_ + 1;
  }
  if (preview_text._4_4_ < 5) {
    lVar3 = 0;
    if (0 < preview_text._4_4_) {
      lVar3 = 0xf;
    }
    local_38 = EditTableSizingFlags::policies[preview_text._4_4_].Name + lVar3;
  }
  else {
    local_38 = "";
  }
  pcStack_20 = local_38;
  puStack_10 = (uint *)p_flags;
  bVar1 = ImGui::BeginCombo("Sizing Policy",local_38,0);
  if (bVar1) {
    for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
      label = EditTableSizingFlags::policies[local_24].Name;
      bVar1 = preview_text._4_4_ == local_24;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd4,0.0,0.0);
      bVar1 = ImGui::Selectable(label,bVar1,0,(ImVec2 *)&stack0xffffffffffffffd4);
      if (bVar1) {
        *puStack_10 = *puStack_10 & 0xffff1fff | EditTableSizingFlags::policies[local_24].Value;
      }
    }
    ImGui::EndCombo();
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    fVar4 = ImGui::GetFontSize();
    ImGui::PushTextWrapPos(fVar4 * 50.0);
    for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
      ImGui::Separator();
      ImGui::Text("%s:",EditTableSizingFlags::policies[local_30].Name);
      ImGui::Separator();
      fVar4 = ImGui::GetCursorPosX();
      pIVar2 = ImGui::GetStyle();
      ImGui::SetCursorPosX(pIVar2->IndentSpacing * 0.5 + fVar4);
      ImGui::TextUnformatted(EditTableSizingFlags::policies[local_30].Tooltip,(char *)0x0);
    }
    ImGui::PopTextWrapPos();
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

static void EditTableSizingFlags(ImGuiTableFlags* p_flags)
{
    struct EnumDesc { ImGuiTableFlags Value; const char* Name; const char* Tooltip; };
    static const EnumDesc policies[] =
    {
        { ImGuiTableFlags_None,               "Default",                            "Use default sizing policy:\n- ImGuiTableFlags_SizingFixedFit if ScrollX is on or if host window has ImGuiWindowFlags_AlwaysAutoResize.\n- ImGuiTableFlags_SizingStretchSame otherwise." },
        { ImGuiTableFlags_SizingFixedFit,     "ImGuiTableFlags_SizingFixedFit",     "Columns default to _WidthFixed (if resizable) or _WidthAuto (if not resizable), matching contents width." },
        { ImGuiTableFlags_SizingFixedSame,    "ImGuiTableFlags_SizingFixedSame",    "Columns are all the same width, matching the maximum contents width.\nImplicitly disable ImGuiTableFlags_Resizable and enable ImGuiTableFlags_NoKeepColumnsVisible." },
        { ImGuiTableFlags_SizingStretchProp,  "ImGuiTableFlags_SizingStretchProp",  "Columns default to _WidthStretch with weights proportional to their widths." },
        { ImGuiTableFlags_SizingStretchSame,  "ImGuiTableFlags_SizingStretchSame",  "Columns default to _WidthStretch with same weights." }
    };
    int idx;
    for (idx = 0; idx < IM_ARRAYSIZE(policies); idx++)
        if (policies[idx].Value == (*p_flags & ImGuiTableFlags_SizingMask_))
            break;
    const char* preview_text = (idx < IM_ARRAYSIZE(policies)) ? policies[idx].Name + (idx > 0 ? strlen("ImGuiTableFlags") : 0) : "";
    if (ImGui::BeginCombo("Sizing Policy", preview_text))
    {
        for (int n = 0; n < IM_ARRAYSIZE(policies); n++)
            if (ImGui::Selectable(policies[n].Name, idx == n))
                *p_flags = (*p_flags & ~ImGuiTableFlags_SizingMask_) | policies[n].Value;
        ImGui::EndCombo();
    }
    ImGui::SameLine();
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered())
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 50.0f);
        for (int m = 0; m < IM_ARRAYSIZE(policies); m++)
        {
            ImGui::Separator();
            ImGui::Text("%s:", policies[m].Name);
            ImGui::Separator();
            ImGui::SetCursorPosX(ImGui::GetCursorPosX() + ImGui::GetStyle().IndentSpacing * 0.5f);
            ImGui::TextUnformatted(policies[m].Tooltip);
        }
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}